

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeDeviceGetP2PProperties
          (ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,
          ze_device_p2p_properties_t *pP2PProperties)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ulong uVar7;
  ulong uVar8;
  ze_result_t unaff_R15D;
  bool bVar9;
  ze_result_t local_9c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeDeviceGetP2PProperties(hDevice, hPeerDevice, pP2PProperties)","")
  ;
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0x140);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar7 = lVar4 - lVar2 >> 3;
    bVar9 = lVar4 != lVar2;
    local_9c = unaff_R15D;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        local_9c = (**(code **)(*plVar5 + 0x150))(plVar5,hDevice,hPeerDevice,pP2PProperties);
        if (local_9c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeDeviceGetP2PProperties",local_9c);
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
        local_9c = unaff_R15D;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return local_9c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZEHandleLifetimeValidation::zeDeviceGetP2PPropertiesPrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hDevice,hPeerDevice,
                           pP2PProperties), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeDeviceGetP2PProperties",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hDevice,hPeerDevice,pP2PProperties);
    bVar9 = lVar4 != lVar2;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar5 + 0x158))(plVar5,hDevice,hPeerDevice,pP2PProperties,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeDeviceGetP2PProperties",result);
          local_9c = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar2 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar9) {
      return local_9c;
    }
  }
  logAndPropagateResult("zeDeviceGetP2PProperties",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetP2PProperties(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
        ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
        ze_device_p2p_properties_t* pP2PProperties      ///< [in,out] Peer-to-Peer properties between source and peer device
        )
    {
        context.logger->log_trace("zeDeviceGetP2PProperties(hDevice, hPeerDevice, pP2PProperties)");

        auto pfnGetP2PProperties = context.zeDdiTable.Device.pfnGetP2PProperties;

        if( nullptr == pfnGetP2PProperties )
            return logAndPropagateResult("zeDeviceGetP2PProperties", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetP2PPropertiesPrologue( hDevice, hPeerDevice, pP2PProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetP2PProperties", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDeviceGetP2PPropertiesPrologue( hDevice, hPeerDevice, pP2PProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetP2PProperties", result);
        }

        auto driver_result = pfnGetP2PProperties( hDevice, hPeerDevice, pP2PProperties );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetP2PPropertiesEpilogue( hDevice, hPeerDevice, pP2PProperties ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetP2PProperties", result);
        }

        return logAndPropagateResult("zeDeviceGetP2PProperties", driver_result);
    }